

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::allocateData(Geometry *this)

{
  Triangle *pTVar1;
  int local_3c;
  MorphTarget *pMStack_38;
  int32 i_2;
  V3d *vdata;
  MorphTarget *mt;
  int32 i_1;
  int32 i;
  uint8 *data;
  int32 sz;
  Geometry *this_local;
  
  data._4_4_ = this->numTriangles * 8;
  if ((this->flags & 8) != 0) {
    data._4_4_ = data._4_4_ + this->numVertices * 4;
  }
  pTVar1 = (Triangle *)
           mustmalloc_LOC((long)(data._4_4_ + this->numTexCoordSets * this->numVertices * 8),0x3000f
                          ,
                          "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 384"
                         );
  this->triangles = pTVar1;
  _i_1 = (TexCoords *)(pTVar1 + this->numTriangles);
  for (mt._4_4_ = 0; mt._4_4_ < this->numTriangles; mt._4_4_ = mt._4_4_ + 1) {
    this->triangles[mt._4_4_].matId = 0xffff;
  }
  if ((this->flags & 8) != 0) {
    this->colors = (RGBA *)_i_1;
    _i_1 = (TexCoords *)(&_i_1->u + this->numVertices);
  }
  for (mt._0_4_ = 0; (int)mt < this->numTexCoordSets; mt._0_4_ = (int)mt + 1) {
    this->texCoords[(int)mt] = _i_1;
    _i_1 = _i_1 + this->numVertices;
  }
  data._4_4_ = this->numVertices * 0xc + 0x28;
  if ((this->flags & 0x10) != 0) {
    data._4_4_ = data._4_4_ + this->numVertices * 0xc;
  }
  vdata = (V3d *)mustrealloc_LOC(this->morphTargets,(long)(data._4_4_ * this->numMorphTargets),
                                 0x3000f,
                                 "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 405"
                                );
  this->morphTargets = (MorphTarget *)vdata;
  pMStack_38 = (MorphTarget *)((long)vdata + (long)this->numMorphTargets * 0x28);
  for (local_3c = 0; local_3c < this->numMorphTargets; local_3c = local_3c + 1) {
    *(Geometry **)vdata = this;
    vdata[2].x = 0.0;
    vdata[2].y = 0.0;
    *(undefined8 *)&vdata[2].z = 0;
    if (this->numVertices != 0) {
      *(MorphTarget **)(vdata + 2) = pMStack_38;
      pMStack_38 = (MorphTarget *)((long)&pMStack_38->parent + (long)this->numVertices * 0xc);
      if ((this->flags & 0x10) != 0) {
        *(MorphTarget **)&vdata[2].z = pMStack_38;
        pMStack_38 = (MorphTarget *)((long)&pMStack_38->parent + (long)this->numVertices * 0xc);
      }
    }
    vdata = (V3d *)&vdata[3].y;
  }
  return;
}

Assistant:

void
Geometry::allocateData(void)
{
	// Geometry data
	// Pretty much copy pasted from ::create above
	int32 sz = this->numTriangles*sizeof(Triangle);
	if(this->flags & PRELIT)
		sz += this->numVertices*sizeof(RGBA);
	sz += this->numTexCoordSets*this->numVertices*sizeof(TexCoords);

	uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
	this->triangles = (Triangle*)data;
	data += this->numTriangles*sizeof(Triangle);
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = 0xFFFF;
	if(this->flags & PRELIT){
		this->colors = (RGBA*)data;
		data += this->numVertices*sizeof(RGBA);
	}
	for(int32 i = 0; i < this->numTexCoordSets; i++){
		this->texCoords[i] = (TexCoords*)data;
		data += this->numVertices*sizeof(TexCoords);
	}

	// MorphTarget data
	// Bounding sphere is copied by realloc.
	sz = sizeof(MorphTarget) + this->numVertices*sizeof(V3d);
	if(this->flags & NORMALS)
		sz += this->numVertices*sizeof(V3d);

	MorphTarget *mt = (MorphTarget*)rwResize(this->morphTargets,
		sz*this->numMorphTargets, MEMDUR_EVENT | ID_GEOMETRY);
	this->morphTargets = mt;
	V3d *vdata = (V3d*)&mt[this->numMorphTargets];
	for(int32 i = 0; i < this->numMorphTargets; i++){
		mt->parent = this;
		mt->vertices = nil;
		mt->normals = nil;
		if(this->numVertices){
			mt->vertices = vdata;
			vdata += this->numVertices;
			if(this->flags & NORMALS){
				mt->normals = vdata;
				vdata += this->numVertices;
			}
		}
		mt++;
	}
}